

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffmkls(fitsfile *fptr,char *keyname,char *value,char *incomm,int *status)

{
  int iVar1;
  int *valuelen;
  size_t sVar2;
  char *in_RCX;
  int *in_R8;
  int tmpcommlen;
  int tmpvlen;
  int commlen;
  int vlen;
  int keypos;
  int nkeys;
  int tstatus;
  int contin;
  int namelen;
  int nchar;
  int nquote;
  int remain;
  int next;
  char *tmplongval;
  char *comm;
  char *cptr;
  char tstring [71];
  char tmpkeyname [81];
  char card [81];
  char valstring [71];
  int *in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe00;
  fitsfile *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 uVar3;
  fitsfile *in_stack_fffffffffffffe38;
  int *__dest;
  int *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  int *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  int local_c;
  
  __dest = (int *)0x0;
  uVar3 = 0xffffffff;
  if (*in_R8 < 1) {
    if ((in_RCX == (char *)0x0) || (*in_RCX == '&')) {
      ffghps(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (int *)0x20083b);
      iVar1 = ffgkcsl(in_stack_fffffffffffffe38,(char *)CONCAT44(uVar3,in_stack_fffffffffffffe30),
                      (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                      (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      if (iVar1 != 0) {
        return *in_R8;
      }
      valuelen = (int *)malloc((long)(in_stack_fffffffffffffe28 + 1));
      in_stack_fffffffffffffe00 = (int *)malloc((long)(in_stack_fffffffffffffe24 + 1));
      in_stack_fffffffffffffdf8 = (int *)&stack0xfffffffffffffe20;
      in_stack_fffffffffffffe08 = (fitsfile *)&stack0xfffffffffffffe1c;
      __dest = in_stack_fffffffffffffe00;
      ffgskyc((fitsfile *)CONCAT44(uVar3,in_stack_fffffffffffffe30),
              (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
              in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
              (char *)in_R8,valuelen,(char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      free(valuelen);
      ffgrec(in_stack_fffffffffffffe08,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
             (char *)in_stack_fffffffffffffdf8,(int *)0x200925);
    }
    else {
      sVar2 = strlen(in_RCX);
      if ((int)sVar2 != 0) {
        __dest = (int *)malloc((long)((int)sVar2 + 1));
        strcpy((char *)__dest,in_RCX);
      }
    }
    iVar1 = ffdkey(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (iVar1 < 1) {
      ffghps(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (int *)0x2009cd);
      fits_make_longstr_key_util((fitsfile *)cptr,comm,tmplongval,_remain,nquote,_contin);
      if (__dest != (int *)0x0) {
        free(__dest);
      }
      local_c = *in_R8;
    }
    else {
      if (__dest != (int *)0x0) {
        free(__dest);
      }
      local_c = *in_R8;
    }
  }
  else {
    local_c = *in_R8;
  }
  return local_c;
}

Assistant:

int ffmkls( fitsfile *fptr,           /* I - FITS file pointer        */
            const char *keyname,      /* I - name of keyword to write */
            const char *value,        /* I - keyword value            */
            const char *incomm,       /* I - keyword comment          */
            int  *status)             /* IO - error status            */
/*
  Modify the value and optionally the comment of a long string keyword.
  This routine supports the
  HEASARC long string convention and can modify arbitrarily long string
  keyword values.  The value is continued over multiple keywords that
  have the name COMTINUE without an equal sign in column 9 of the card.
  This routine also supports simple string keywords which are less than
  69 characters in length.

  This routine is not very efficient, so it should be used sparingly.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD], tmpkeyname[FLEN_CARD];
    char tstring[FLEN_VALUE], *cptr;
    char *comm=0, *tmplongval=0;
    int next, remain, nquote, nchar, namelen, contin, tstatus = -1;
    int nkeys, keypos;
    int vlen, commlen, tmpvlen, tmpcommlen;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (!incomm || incomm[0] == '&')  /* preserve the old comment string */
    {
        ffghps(fptr, &nkeys, &keypos, status); /* save current position */
        
        if (ffgkcsl(fptr, keyname, &vlen, &commlen, status))
           return(*status); /* keyword doesn't exist or is bad format */
        tmplongval = (char *)malloc(vlen+1);
        comm = (char *)malloc(commlen+1);
        ffgskyc(fptr, keyname, 1, vlen, commlen, tmplongval, &tmpvlen,
                comm, &tmpcommlen, status);
        free(tmplongval); 

        /* move back to previous position to ensure that we delete */
        /* the right keyword in case there are more than one keyword */
        /* with this same name. */
        ffgrec(fptr, keypos - 1, card, status); 
    } else {
        /* copy the input comment string */
        commlen = (int)strlen(incomm);
        if (commlen)
        {
           comm = (char *)malloc(commlen+1);
           strcpy(comm,incomm);
        }
    }

    /* delete the old keyword */
    if (ffdkey(fptr, keyname, status) > 0)
    {
        if (comm)  free(comm);
        return(*status);            /* keyword doesn't exist */
    }

    ffghps(fptr, &nkeys, &keypos, status); /* save current position */

    fits_make_longstr_key_util(fptr, keyname, value, comm, keypos, status);

    if (comm)  free(comm);
    return(*status);
}